

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc1.c
# Opt level: O1

void mbc1_reset(gb_cart_t *cart)

{
  if (cart != (gb_cart_t *)0x0) {
    *(undefined2 *)cart->mbc_state = 0;
    cart->curr_rom_bank = 1;
    cart->curr_ram_bank = 0;
    return;
  }
  __assert_fail("cart != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc1.c"
                ,0x24,"void mbc1_reset(gb_cart_t *)");
}

Assistant:

void mbc1_reset(gb_cart_t *cart)
{
    assert(cart != NULL);

    mbc1_state_t *state = (mbc1_state_t*)cart->mbc_state;
    state->ram_enabled = false;
    state->second_mode = false;
    cart->curr_rom_bank = 1;
    cart->curr_ram_bank = 0;
}